

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderStorageBufferObjectTests.cpp
# Opt level: O3

long __thiscall
gl4cts::anon_unknown_0::AdvancedUnsizedArrayLength::Run(AdvancedUnsizedArrayLength *this)

{
  CallLogWrapper *this_00;
  bool bVar1;
  GLuint GVar2;
  long lVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  int data [7];
  string local_68;
  string local_48;
  
  bVar1 = ShaderStorageBufferObjectBase::SupportedInVS(&this->super_ShaderStorageBufferObjectBase,5)
  ;
  lVar3 = 0x10;
  if (bVar1) {
    local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_68,
               "\nlayout(std430, binding = 0) readonly buffer Input0 {\n  int g_input0[];\n};\nlayout(std430, binding = 1) readonly buffer Input1 {\n  int data[];\n} g_input1;\nlayout(std430, binding = 2) readonly buffer Input23 {\n  int data[];\n} g_input23[2];\nlayout(std430, binding = 4) buffer Output {\n  int g_length[4];\n  int g_length2;\n};\nvoid main() {\n  g_length[0] = g_input0.length();\n  g_length[1] = g_input1.data.length();\n  g_length[2] = g_input23[0].data.length();\n  g_length[3] = g_input23[1].data.length();\n  g_length2 = g_length.length();\n}"
               ,"");
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,0x1aee929);
    GVar2 = ShaderStorageBufferObjectBase::CreateProgram
                      (&this->super_ShaderStorageBufferObjectBase,&local_68,&local_48);
    this->m_program = GVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p,
                      CONCAT44(local_68.field_2._M_allocated_capacity._4_4_,
                               local_68.field_2._M_allocated_capacity._0_4_) + 1);
    }
    this_00 = &(this->super_ShaderStorageBufferObjectBase).super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glLinkProgram(this_00,this->m_program);
    bVar1 = ShaderStorageBufferObjectBase::CheckProgram
                      (&this->super_ShaderStorageBufferObjectBase,this->m_program);
    lVar3 = -1;
    if (bVar1) {
      glu::CallLogWrapper::glGenVertexArrays(this_00,1,&this->m_vertex_array);
      glu::CallLogWrapper::glGenBuffers(this_00,5,this->m_storage_buffer);
      local_68.field_2._M_allocated_capacity._0_4_ = 5;
      local_68.field_2._M_allocated_capacity._4_4_ = 6;
      local_68.field_2._8_4_ = 7;
      local_68._M_dataplus._M_p = (pointer)0x200000001;
      local_68._M_string_length._0_4_ = 3;
      local_68._M_string_length._4_4_ = 4;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,0,this->m_storage_buffer[0]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x1c,&local_68,0x88ea);
      local_68._M_dataplus._M_p = (pointer)0x200000001;
      local_68._M_string_length._0_4_ = 3;
      local_68._M_string_length._4_4_ = 4;
      local_68.field_2._M_allocated_capacity._0_4_ = 5;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,1,this->m_storage_buffer[1]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x14,&local_68,0x88ea);
      local_68._M_dataplus._M_p = (pointer)0x200000001;
      local_68._M_string_length._0_4_ = 3;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,2,this->m_storage_buffer[2]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0xc,&local_68,0x88ea);
      local_68._M_dataplus._M_p = (pointer)0x200000001;
      local_68._M_string_length._0_4_ = 3;
      local_68._M_string_length._4_4_ = 4;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,3,this->m_storage_buffer[3]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x10,&local_68,0x88ea);
      local_68._M_dataplus._M_p = (pointer)0x0;
      local_68._M_string_length._0_4_ = 0;
      local_68._M_string_length._4_4_ = 0;
      local_68.field_2._M_allocated_capacity._0_4_ = 0;
      glu::CallLogWrapper::glBindBufferBase(this_00,0x90d2,4,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glBufferData(this_00,0x90d2,0x14,&local_68,0x88ea);
      glu::CallLogWrapper::glEnable(this_00,0x8c89);
      glu::CallLogWrapper::glUseProgram(this_00,this->m_program);
      glu::CallLogWrapper::glBindVertexArray(this_00,this->m_vertex_array);
      glu::CallLogWrapper::glDrawArrays(this_00,0,0,1);
      glu::CallLogWrapper::glMemoryBarrier(this_00,0x200);
      glu::CallLogWrapper::glBindBuffer(this_00,0x90d2,this->m_storage_buffer[4]);
      glu::CallLogWrapper::glGetBufferSubData(this_00,0x90d2,0,0x14,&local_68);
      bVar1 = (int)local_68._M_dataplus._M_p == 7;
      if (!bVar1) {
        anon_unknown_0::Output("Array 0 length is %d should be 7.\n");
      }
      bVar4 = local_68._M_dataplus._M_p._4_4_ == 5;
      if (!bVar4) {
        anon_unknown_0::Output("Array 1 length is %d should be 5.\n");
      }
      bVar5 = (int)local_68._M_string_length == 3;
      if (!bVar5) {
        anon_unknown_0::Output("Array 2 length is %d should be 3.\n");
      }
      bVar6 = local_68._M_string_length._4_4_ == 4;
      if (!bVar6) {
        anon_unknown_0::Output("Array 3 length is %d should be 4.\n");
      }
      if (local_68.field_2._M_allocated_capacity._0_4_ == 4) {
        lVar3 = (ulong)(bVar6 && (bVar5 && (bVar4 && bVar1))) - 1;
      }
      else {
        anon_unknown_0::Output("Array 4 length is %d should be 4.\n");
      }
    }
  }
  return lVar3;
}

Assistant:

virtual long Run()
	{
		if (!SupportedInVS(5))
			return NOT_SUPPORTED;

		const char* const glsl_vs =
			NL "layout(std430, binding = 0) readonly buffer Input0 {" NL "  int g_input0[];" NL "};" NL
			   "layout(std430, binding = 1) readonly buffer Input1 {" NL "  int data[];" NL "} g_input1;" NL
			   "layout(std430, binding = 2) readonly buffer Input23 {" NL "  int data[];" NL "} g_input23[2];" NL
			   "layout(std430, binding = 4) buffer Output {" NL "  int g_length[4];" NL "  int g_length2;" NL "};" NL
			   "void main() {" NL "  g_length[0] = g_input0.length();" NL "  g_length[1] = g_input1.data.length();" NL
			   "  g_length[2] = g_input23[0].data.length();" NL "  g_length[3] = g_input23[1].data.length();" NL
			   "  g_length2 = g_length.length();" NL "}";

		m_program = CreateProgram(glsl_vs, "");
		glLinkProgram(m_program);
		if (!CheckProgram(m_program))
			return ERROR;

		glGenVertexArrays(1, &m_vertex_array);
		glGenBuffers(5, m_storage_buffer);

		/* input 0 */
		{
			int data[7] = { 1, 2, 3, 4, 5, 6, 7 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_storage_buffer[0]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 1 */
		{
			int data[5] = { 1, 2, 3, 4, 5 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storage_buffer[1]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 2 */
		{
			int data[3] = { 1, 2, 3 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storage_buffer[2]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* input 3 */
		{
			int data[4] = { 1, 2, 3, 4 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 3, m_storage_buffer[3]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}
		/* output */
		{
			int data[5] = { 0 };
			glBindBufferBase(GL_SHADER_STORAGE_BUFFER, 4, m_storage_buffer[4]);
			glBufferData(GL_SHADER_STORAGE_BUFFER, sizeof(data), data, GL_DYNAMIC_COPY);
		}

		glEnable(GL_RASTERIZER_DISCARD);
		glUseProgram(m_program);
		glBindVertexArray(m_vertex_array);
		glDrawArrays(GL_POINTS, 0, 1);

		glMemoryBarrier(GL_BUFFER_UPDATE_BARRIER_BIT);

		/* output */
		{
			int data[5];
			glBindBuffer(GL_SHADER_STORAGE_BUFFER, m_storage_buffer[4]);
			glGetBufferSubData(GL_SHADER_STORAGE_BUFFER, 0, sizeof(data), data);
			bool status = true;
			if (data[0] != 7)
			{
				Output("Array 0 length is %d should be 7.\n", data[0]);
				status = false;
			}
			if (data[1] != 5)
			{
				Output("Array 1 length is %d should be 5.\n", data[1]);
				status = false;
			}
			if (data[2] != 3)
			{
				Output("Array 2 length is %d should be 3.\n", data[2]);
				status = false;
			}
			if (data[3] != 4)
			{
				Output("Array 3 length is %d should be 4.\n", data[3]);
				status = false;
			}
			if (data[4] != 4)
			{
				Output("Array 4 length is %d should be 4.\n", data[4]);
				status = false;
			}
			if (!status)
				return ERROR;
		}

		return NO_ERROR;
	}